

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3HashInsertElement(Fts3Hash *pH,_fts3ht *pEntry,Fts3HashElem *pNew)

{
  Fts3HashElem *pFVar1;
  Fts3HashElem *pHead;
  Fts3HashElem *pNew_local;
  _fts3ht *pEntry_local;
  Fts3Hash *pH_local;
  
  pFVar1 = pEntry->chain;
  if (pFVar1 == (Fts3HashElem *)0x0) {
    pNew->next = pH->first;
    if (pH->first != (Fts3HashElem *)0x0) {
      pH->first->prev = pNew;
    }
    pNew->prev = (Fts3HashElem *)0x0;
    pH->first = pNew;
  }
  else {
    pNew->next = pFVar1;
    pNew->prev = pFVar1->prev;
    if (pFVar1->prev == (Fts3HashElem *)0x0) {
      pH->first = pNew;
    }
    else {
      pFVar1->prev->next = pNew;
    }
    pFVar1->prev = pNew;
  }
  pEntry->count = pEntry->count + 1;
  pEntry->chain = pNew;
  return;
}

Assistant:

static void fts3HashInsertElement(
  Fts3Hash *pH,            /* The complete hash table */
  struct _fts3ht *pEntry,  /* The entry into which pNew is inserted */
  Fts3HashElem *pNew       /* The element to be inserted */
){
  Fts3HashElem *pHead;     /* First element already in pEntry */
  pHead = pEntry->chain;
  if( pHead ){
    pNew->next = pHead;
    pNew->prev = pHead->prev;
    if( pHead->prev ){ pHead->prev->next = pNew; }
    else             { pH->first = pNew; }
    pHead->prev = pNew;
  }else{
    pNew->next = pH->first;
    if( pH->first ){ pH->first->prev = pNew; }
    pNew->prev = 0;
    pH->first = pNew;
  }
  pEntry->count++;
  pEntry->chain = pNew;
}